

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::coordinateBindingTest<false>(ViewTest *this)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  reference piVar4;
  undefined8 extraout_RAX;
  size_t sVar5;
  undefined8 uVar6;
  logic_error *plVar7;
  ulong uVar8;
  code *pcVar9;
  int iVar10;
  undefined *puVar11;
  int *piVar12;
  bool bVar13;
  long lVar14;
  size_t sVar15;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  View<int,_false,_std::allocator<unsigned_long>_> w;
  int local_e4;
  int *local_e0;
  undefined1 local_d8 [16];
  size_t *local_c8;
  size_t local_b0;
  size_t local_a8;
  unsigned_long *local_98;
  unsigned_long *local_90;
  View<int,_false,_std::allocator<unsigned_long>_> local_88;
  uint local_48;
  uint local_44;
  unsigned_long *local_40;
  ulong local_38;
  
  _Var3._M_current = (unsigned_long *)operator_new(8);
  *_Var3._M_current = 0x18;
  local_e0 = this->data_;
  local_d8._0_8_ = local_e0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_88);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,0,7);
  if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
    pcVar9 = std::runtime_error::~runtime_error;
    puVar11 = &std::runtime_error::typeinfo;
LAB_001aa081:
    __cxa_throw(plVar7,puVar11,pcVar9);
  }
  if ((local_88.geometry_.dimension_ != 0) || (local_88.geometry_.size_ != 1)) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    pcVar9 = std::logic_error::~logic_error;
    puVar11 = &std::logic_error::typeinfo;
    goto LAB_001aa081;
  }
  local_e4 = 0;
  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
  if (*piVar4 != 7) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
  operator_delete(local_c8,local_b0 * 0x18);
  operator_delete(_Var3._M_current,8);
  _Var3._M_current = (unsigned_long *)operator_new(0x10);
  *_Var3._M_current = 6;
  _Var3._M_current[1] = 4;
  local_d8._0_8_ = local_e0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_88);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,0,3);
  if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
    pcVar9 = std::runtime_error::~runtime_error;
    puVar11 = &std::runtime_error::typeinfo;
LAB_001aa111:
    __cxa_throw(plVar7,puVar11,pcVar9);
  }
  if ((local_88.geometry_.dimension_ != 1) || (local_88.geometry_.size_ != 4)) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    pcVar9 = std::logic_error::~logic_error;
    puVar11 = &std::logic_error::typeinfo;
    goto LAB_001aa111;
  }
  local_e4 = 0;
  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
  if (*piVar4 != 3) {
LAB_001a9df1:
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_e4 = 1;
  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
  if (*piVar4 != 9) goto LAB_001a9df1;
  local_e4 = 2;
  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
  if (*piVar4 != 0xf) goto LAB_001a9df1;
  local_e4 = 3;
  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
  if (*piVar4 != 0x15) goto LAB_001a9df1;
  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
  operator_delete(local_c8,local_b0 * 0x18);
  operator_delete(_Var3._M_current,0x10);
  _Var3._M_current = (unsigned_long *)operator_new(0x10);
  *_Var3._M_current = 6;
  _Var3._M_current[1] = 4;
  local_88.data_._0_4_ = 0;
  local_d8._0_8_ = local_e0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 2),(CoordinateOrder *)&local_88,&andres::defaultOrder,
             (allocator_type *)&local_e4);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,0,3);
  if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
    pcVar9 = std::runtime_error::~runtime_error;
    puVar11 = &std::runtime_error::typeinfo;
LAB_001aa16f:
    __cxa_throw(plVar7,puVar11,pcVar9);
  }
  if ((local_88.geometry_.dimension_ != 1) || (local_88.geometry_.size_ != 4)) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    pcVar9 = std::logic_error::~logic_error;
    puVar11 = &std::logic_error::typeinfo;
    goto LAB_001aa16f;
  }
  local_e4 = 0;
  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
  if (*piVar4 != 0xc) {
LAB_001a9e23:
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_e4 = 1;
  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
  if (*piVar4 != 0xd) goto LAB_001a9e23;
  local_e4 = 2;
  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
  if (*piVar4 != 0xe) goto LAB_001a9e23;
  local_e4 = 3;
  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
  if (*piVar4 != 0xf) goto LAB_001a9e23;
  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
  operator_delete(local_c8,local_b0 * 0x18);
  operator_delete(_Var3._M_current,0x10);
  _Var3._M_current = (unsigned_long *)operator_new(0x10);
  *_Var3._M_current = 6;
  _Var3._M_current[1] = 4;
  local_d8._0_8_ = local_e0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_88);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,1,2);
  if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
    pcVar9 = std::runtime_error::~runtime_error;
    puVar11 = &std::runtime_error::typeinfo;
LAB_001aa1cd:
    __cxa_throw(plVar7,puVar11,pcVar9);
  }
  if ((local_88.geometry_.dimension_ != 1) || (local_88.geometry_.size_ != 6)) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    pcVar9 = std::logic_error::~logic_error;
    puVar11 = &std::logic_error::typeinfo;
    goto LAB_001aa1cd;
  }
  lVar14 = 0;
  do {
    local_e4 = (int)lVar14;
    piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
             execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
    if (*piVar4 != this->data_[lVar14 + 0xc]) {
      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar7,"test failed.");
      __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    lVar14 = lVar14 + 1;
  } while ((int)lVar14 != 6);
  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
  operator_delete(local_c8,local_b0 * 0x18);
  operator_delete(_Var3._M_current,0x10);
  _Var3._M_current = (unsigned_long *)operator_new(0x10);
  *_Var3._M_current = 6;
  _Var3._M_current[1] = 4;
  local_88.data_._0_4_ = 0;
  local_d8._0_8_ = local_e0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 2),(CoordinateOrder *)&local_88,&andres::defaultOrder,
             (allocator_type *)&local_e4);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,1,2);
  if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
    pcVar9 = std::runtime_error::~runtime_error;
    puVar11 = &std::runtime_error::typeinfo;
LAB_001aa22b:
    __cxa_throw(plVar7,puVar11,pcVar9);
  }
  if ((local_88.geometry_.dimension_ != 1) || (local_88.geometry_.size_ != 6)) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    pcVar9 = std::logic_error::~logic_error;
    puVar11 = &std::logic_error::typeinfo;
    goto LAB_001aa22b;
  }
  piVar12 = &DAT_00238a70;
  lVar14 = 0;
  do {
    local_e4 = (int)lVar14;
    piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
             execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_e4);
    if (*piVar4 != *piVar12) {
      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar7,"test failed.");
      __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    lVar14 = lVar14 + 1;
    piVar12 = piVar12 + 1;
  } while (lVar14 != 6);
  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
  operator_delete(local_c8,local_b0 * 0x18);
  operator_delete(_Var3._M_current,0x10);
  local_98 = (unsigned_long *)operator_new(0x18);
  *local_98 = 3;
  local_98[1] = 4;
  local_98[2] = 2;
  local_d8._0_8_ = local_e0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_98,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(local_98 + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_88);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,0,2);
  if (local_88.geometry_.size_ == 8) {
    if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
      pcVar9 = std::runtime_error::~runtime_error;
      puVar11 = &std::runtime_error::typeinfo;
      goto LAB_001aa25d;
    }
    if (local_88.geometry_.dimension_ == 2) {
      local_90 = (unsigned_long *)0x0;
      iVar10 = 0;
      bVar1 = true;
      do {
        bVar13 = bVar1;
        iVar2 = (int)local_90;
        local_90 = (unsigned_long *)((long)iVar2 + 4);
        sVar15 = 0;
        do {
          piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&local_88,sVar15,
                              iVar10);
          if (*piVar4 != (&DAT_00238c10)[sVar15 + (long)iVar2]) {
            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar7,"test failed.");
            __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          sVar15 = sVar15 + 1;
        } while (sVar15 != 4);
        iVar10 = 1;
        bVar1 = false;
      } while (bVar13);
      operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
      operator_delete(local_c8,local_b0 * 0x18);
      operator_delete(local_98,0x18);
      local_98 = (unsigned_long *)operator_new(0x18);
      *local_98 = 3;
      local_98[1] = 4;
      local_98[2] = 2;
      local_88.data_._0_4_ = 0;
      local_d8._0_8_ = local_e0;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_98,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(local_98 + 3),(CoordinateOrder *)&local_88,&andres::defaultOrder,
                 (allocator_type *)&local_e4);
      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
      andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
                (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,0,2);
      if (local_88.geometry_.size_ == 8) {
        if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
          goto LAB_001aa28f;
        }
        if (local_88.geometry_.dimension_ == 2) {
          local_90 = (unsigned_long *)0x0;
          iVar10 = 0;
          bVar1 = true;
          do {
            bVar13 = bVar1;
            iVar2 = (int)local_90;
            local_90 = (unsigned_long *)((long)iVar2 + 4);
            sVar15 = 0;
            do {
              piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                 ((View<int,false,std::allocator<unsigned_long>> *)&local_88,sVar15,
                                  iVar10);
              if (*piVar4 != (&DAT_00238c30)[sVar15 + (long)iVar2]) {
                plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar7,"test failed.");
                __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar15 = sVar15 + 1;
            } while (sVar15 != 4);
            iVar10 = 1;
            bVar1 = false;
          } while (bVar13);
          operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
          operator_delete(local_c8,local_b0 * 0x18);
          operator_delete(local_98,0x18);
          local_98 = (unsigned_long *)operator_new(0x18);
          *local_98 = 3;
          local_98[1] = 4;
          local_98[2] = 2;
          local_d8._0_8_ = local_e0;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )local_98,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(local_98 + 3),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)&local_88);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
                    (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,1,2);
          if (local_88.geometry_.size_ == 6) {
            if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
              pcVar9 = std::runtime_error::~runtime_error;
              puVar11 = &std::runtime_error::typeinfo;
              goto LAB_001aa2c1;
            }
            if (local_88.geometry_.dimension_ == 2) {
              local_90 = (unsigned_long *)0x0;
              iVar10 = 0;
              bVar1 = true;
              do {
                bVar13 = bVar1;
                iVar2 = (int)local_90;
                local_90 = (unsigned_long *)((long)iVar2 + 3);
                sVar15 = 0;
                do {
                  piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                     ((View<int,false,std::allocator<unsigned_long>> *)&local_88,
                                      sVar15,iVar10);
                  if (*piVar4 != (&DAT_00238a90)[sVar15 + (long)iVar2]) {
                    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar7,"test failed.");
                    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                  sVar15 = sVar15 + 1;
                } while (sVar15 != 3);
                iVar10 = 1;
                bVar1 = false;
              } while (bVar13);
              operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
              operator_delete(local_c8,local_b0 * 0x18);
              operator_delete(local_98,0x18);
              local_98 = (unsigned_long *)operator_new(0x18);
              *local_98 = 3;
              local_98[1] = 4;
              local_98[2] = 2;
              local_88.data_._0_4_ = 0;
              local_d8._0_8_ = local_e0;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )local_98,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(local_98 + 3),(CoordinateOrder *)&local_88,&andres::defaultOrder,
                         (allocator_type *)&local_e4);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
                        (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,1,2)
              ;
              if (local_88.geometry_.size_ == 6) {
                if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
                  pcVar9 = std::runtime_error::~runtime_error;
                  puVar11 = &std::runtime_error::typeinfo;
                  goto LAB_001aa2f3;
                }
                if (local_88.geometry_.dimension_ == 2) {
                  iVar10 = 0;
                  local_90 = (unsigned_long *)0x0;
                  bVar1 = true;
                  do {
                    bVar13 = bVar1;
                    iVar2 = (int)local_90;
                    local_90 = (unsigned_long *)((long)iVar2 + 3);
                    sVar15 = 0;
                    do {
                      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)&local_88
                                          ,sVar15,iVar10);
                      if (*piVar4 != (&DAT_00238ab0)[sVar15 + (long)iVar2]) {
                        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar7,"test failed.");
                        __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      sVar15 = sVar15 + 1;
                    } while (sVar15 != 3);
                    iVar10 = 1;
                    bVar1 = false;
                  } while (bVar13);
                  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
                  operator_delete(local_c8,local_b0 * 0x18);
                  operator_delete(local_98,0x18);
                  _Var3._M_current = (unsigned_long *)operator_new(0x10);
                  *_Var3._M_current = 1;
                  _Var3._M_current[1] = 1;
                  local_d8._0_8_ = local_e0;
                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),_Var3,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(_Var3._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                             (allocator_type *)&local_88);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
                  if (local_a8 == 1) {
                    if ((int *)local_d8._0_8_ == (int *)0x0) {
                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.")
                      ;
                      pcVar9 = std::runtime_error::~runtime_error;
                      puVar11 = &std::runtime_error::typeinfo;
                      goto LAB_001aa325;
                    }
                    if (local_b0 == 0) {
                      local_88.data_._0_4_ = 0;
                      piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                               execute<int,int,false,std::allocator<unsigned_long>>
                                         ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                          local_d8,(int *)&local_88);
                      if (*piVar4 != 0) {
                        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar7,"test failed.");
                        __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      operator_delete(local_c8,local_b0 * 0x18);
                      operator_delete(_Var3._M_current,0x10);
                      _Var3._M_current = (unsigned_long *)operator_new(0x10);
                      *_Var3._M_current = 0x18;
                      _Var3._M_current[1] = 1;
                      local_d8._0_8_ = local_e0;
                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),_Var3,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )(_Var3._M_current + 2),&andres::defaultOrder,
                                 &andres::defaultOrder,(allocator_type *)&local_88);
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
                      if (local_a8 == 0x18) {
                        if ((int *)local_d8._0_8_ == (int *)0x0) {
                          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar7,"Assertion failed.");
                          pcVar9 = std::runtime_error::~runtime_error;
                          puVar11 = &std::runtime_error::typeinfo;
                          goto LAB_001aa389;
                        }
                        if (local_b0 == 1) {
                          lVar14 = 0;
                          do {
                            local_88.data_._0_4_ = (undefined4)lVar14;
                            piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                                     execute<int,int,false,std::allocator<unsigned_long>>
                                               ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_d8,(int *)&local_88);
                            if (*piVar4 != local_e0[lVar14]) {
                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar7,"test failed.");
                              __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                          std::logic_error::~logic_error);
                            }
                            lVar14 = lVar14 + 1;
                          } while (lVar14 != 0x18);
                          operator_delete(local_c8,local_b0 * 0x18);
                          operator_delete(_Var3._M_current,0x10);
                          _Var3._M_current = (unsigned_long *)operator_new(0x18);
                          *_Var3._M_current = 1;
                          _Var3._M_current[1] = 1;
                          _Var3._M_current[2] = 1;
                          local_d8._0_8_ = local_e0;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),_Var3
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var3._M_current + 3),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_88);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
                          if (local_a8 == 1) {
                            if ((int *)local_d8._0_8_ == (int *)0x0) {
                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar7,"Assertion failed.");
                              pcVar9 = std::runtime_error::~runtime_error;
                              puVar11 = &std::runtime_error::typeinfo;
                              goto LAB_001aa3bb;
                            }
                            if (local_b0 == 0) {
                              local_88.data_._0_4_ = 0;
                              piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                                       execute<int,int,false,std::allocator<unsigned_long>>
                                                 ((View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_d8,(int *)&local_88);
                              if (*piVar4 != 0) {
                                plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar7,"test failed.");
                                __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                            std::logic_error::~logic_error);
                              }
                              operator_delete(local_c8,local_b0 * 0x18);
                              operator_delete(_Var3._M_current,0x18);
                              _Var3._M_current = (unsigned_long *)operator_new(0x18);
                              *_Var3._M_current = 1;
                              _Var3._M_current[1] = 0x18;
                              _Var3._M_current[2] = 1;
                              local_d8._0_8_ = local_e0;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),
                                         _Var3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var3._M_current + 3),&andres::defaultOrder,
                                         &andres::defaultOrder,(allocator_type *)&local_88);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_d8);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                                        ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_d8);
                              if (local_a8 == 0x18) {
                                if ((int *)local_d8._0_8_ == (int *)0x0) {
                                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar7,"Assertion failed.");
                                  pcVar9 = std::runtime_error::~runtime_error;
                                  puVar11 = &std::runtime_error::typeinfo;
                                  goto LAB_001aa41f;
                                }
                                if (local_b0 == 1) {
                                  lVar14 = 0;
                                  do {
                                    local_88.data_._0_4_ = (undefined4)lVar14;
                                    piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,false,std::allocator<unsigned_long>>
                                                       ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_d8,(int *)&local_88);
                                    if (*piVar4 != local_e0[lVar14]) {
                                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar7,"test failed.");
                                      __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                                  std::logic_error::~logic_error);
                                    }
                                    lVar14 = lVar14 + 1;
                                  } while (lVar14 != 0x18);
                                  operator_delete(local_c8,local_b0 * 0x18);
                                  operator_delete(_Var3._M_current,0x18);
                                  local_90 = (unsigned_long *)operator_new(0x18);
                                  *local_90 = 1;
                                  local_90[1] = 3;
                                  local_90[2] = 2;
                                  local_d8._0_8_ = local_e0;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_d8 + 8),
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )local_90,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(local_90 + 3),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)&local_88);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_d8);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                                            ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                             local_d8);
                                  if (local_a8 == 6) {
                                    if ((int *)local_d8._0_8_ == (int *)0x0) {
                                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                ((runtime_error *)plVar7,"Assertion failed.");
                                      pcVar9 = std::runtime_error::~runtime_error;
                                      puVar11 = &std::runtime_error::typeinfo;
                                      goto LAB_001aa451;
                                    }
                                    if (local_b0 == 2) {
                                      iVar10 = 0;
                                      lVar14 = 0;
                                      bVar1 = true;
                                      do {
                                        bVar13 = bVar1;
                                        piVar12 = local_e0;
                                        iVar2 = (int)lVar14;
                                        lVar14 = (long)iVar2 + 3;
                                        sVar15 = 0;
                                        do {
                                          piVar4 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_d8,sVar15,iVar10);
                                          if (*piVar4 != piVar12[(long)iVar2 + sVar15]) {
                                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar7,"test failed.");
                                            __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          sVar15 = sVar15 + 1;
                                        } while (sVar15 != 3);
                                        iVar10 = 1;
                                        bVar1 = false;
                                      } while (bVar13);
                                      operator_delete(local_c8,local_b0 * 0x18);
                                      operator_delete(local_90,0x18);
                                      local_40 = (unsigned_long *)operator_new(0x30);
                                      *local_40 = 1;
                                      local_40[1] = 2;
                                      local_40[2] = 1;
                                      local_40[3] = 1;
                                      local_40[4] = 3;
                                      local_40[5] = 2;
                                      local_d8._0_8_ = local_e0;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_d8 + 8),
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_40,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40 + 6),&andres::defaultOrder,
                                                 &andres::defaultOrder,(allocator_type *)&local_88);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      squeeze((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_d8);
                                      if (local_a8 == 0xc) {
                                        if ((int *)local_d8._0_8_ == (int *)0x0) {
                                          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar7,"Assertion failed.");
                                          pcVar9 = std::runtime_error::~runtime_error;
                                          puVar11 = &std::runtime_error::typeinfo;
                                          goto LAB_001aa483;
                                        }
                                        if (local_b0 == 3) {
                                          local_98 = (unsigned_long *)0x0;
                                          uVar6 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                                          uVar8 = 0;
                                          do {
                                            local_44 = (uint)uVar6;
                                            local_48 = (int)uVar8 + 6;
                                            local_90 = (unsigned_long *)0x0;
                                            local_38 = uVar8;
                                            do {
                                              piVar12 = local_e0 + (int)local_38;
                                              local_38 = (ulong)((int)local_38 + 2);
                                              lVar14 = 0;
                                              bVar1 = true;
                                              do {
                                                bVar13 = bVar1;
                                                andres::
                                                View<int,_false,_std::allocator<unsigned_long>_>::
                                                testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                uVar6 = local_d8._0_8_;
                                                if (((int *)local_d8._0_8_ == (int *)0x0) ||
                                                   (local_b0 != 3)) {
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar11 = &std::runtime_error::typeinfo;
LAB_001a9c27:
                                                  __cxa_throw(plVar7,puVar11,pcVar9);
                                                }
                                                sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_d8,0);
                                                sVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_d8,3,(size_t)local_90,(int)local_98);
                                                if (*(int *)(uVar6 + (sVar15 * lVar14 + sVar5) * 4)
                                                    != *piVar12) {
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar11 = &std::logic_error::typeinfo;
                                                  goto LAB_001a9c27;
                                                }
                                                piVar12 = piVar12 + 1;
                                                lVar14 = 1;
                                                bVar1 = false;
                                              } while (bVar13);
                                              local_90 = (unsigned_long *)((long)local_90 + 1);
                                            } while (local_90 != (unsigned_long *)0x3);
                                            local_98 = (unsigned_long *)0x1;
                                            uVar6 = 0;
                                            uVar8 = (ulong)local_48;
                                            if ((local_44 & 1) == 0) {
                                              operator_delete(local_c8,local_b0 * 0x18);
                                              operator_delete(local_40,0x30);
                                              return;
                                            }
                                          } while( true );
                                        }
                                      }
                                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar7,"test failed.");
                                      pcVar9 = std::logic_error::~logic_error;
                                      puVar11 = &std::logic_error::typeinfo;
LAB_001aa483:
                                      __cxa_throw(plVar7,puVar11,pcVar9);
                                    }
                                  }
                                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar7,"test failed.");
                                  pcVar9 = std::logic_error::~logic_error;
                                  puVar11 = &std::logic_error::typeinfo;
LAB_001aa451:
                                  __cxa_throw(plVar7,puVar11,pcVar9);
                                }
                              }
                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar7,"test failed.");
                              pcVar9 = std::logic_error::~logic_error;
                              puVar11 = &std::logic_error::typeinfo;
LAB_001aa41f:
                              __cxa_throw(plVar7,puVar11,pcVar9);
                            }
                          }
                          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar7,"test failed.");
                          pcVar9 = std::logic_error::~logic_error;
                          puVar11 = &std::logic_error::typeinfo;
LAB_001aa3bb:
                          __cxa_throw(plVar7,puVar11,pcVar9);
                        }
                      }
                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar7,"test failed.");
                      pcVar9 = std::logic_error::~logic_error;
                      puVar11 = &std::logic_error::typeinfo;
LAB_001aa389:
                      __cxa_throw(plVar7,puVar11,pcVar9);
                    }
                  }
                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar7,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar11 = &std::logic_error::typeinfo;
LAB_001aa325:
                  __cxa_throw(plVar7,puVar11,pcVar9);
                }
              }
              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar7,"test failed.");
              pcVar9 = std::logic_error::~logic_error;
              puVar11 = &std::logic_error::typeinfo;
LAB_001aa2f3:
              __cxa_throw(plVar7,puVar11,pcVar9);
            }
          }
          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar7,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
LAB_001aa2c1:
          __cxa_throw(plVar7,puVar11,pcVar9);
        }
      }
      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar7,"test failed.");
      pcVar9 = std::logic_error::~logic_error;
      puVar11 = &std::logic_error::typeinfo;
LAB_001aa28f:
      __cxa_throw(plVar7,puVar11,pcVar9);
    }
  }
  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar7,"test failed.");
  pcVar9 = std::logic_error::~logic_error;
  puVar11 = &std::logic_error::typeinfo;
LAB_001aa25d:
  __cxa_throw(plVar7,puVar11,pcVar9);
}

Assistant:

void ViewTest::coordinateBindingTest() {
    // 1D
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,7);
            test(w.dimension()==0 && w.size()==1);
            test(w(0)==7);
        }
    }
    // 2D with... 
    {
        // bind(0,x)
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,3);
            test(w.dimension()==1 && w.size()==4);
            test(w(0)==3 && w(1)==9 && w(2)==15 && w(3)==21);
        }
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(0,3);
            
            test(w.dimension()==1 && w.size()==4);
            test(w(0)==12 && w(1)==13 && w(2)==14 && w(3)==15);
        }
        // bind(1,x)
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.dimension()==1 && w.size()==6);
            int i = 12; 
            for(int x = 0; x < 6; ++x){
                test(w(x) == data_[i]);
                ++i;
            }
        }
        {
            int list[] = {2, 6, 10, 14, 18, 22};
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.dimension()==1 && w.size()==6);
            for(int x = 0; x < 6; ++x){
                test(w(x) == list[x]);
            }
        }
    }
    // 3D with...
    {
        // bind(0,x)
        {
            int list[] = {2, 5, 8, 11, 14, 17, 20, 23};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,2);
        
            test(w.size()==8 && w.dimension()==2);
            int index = 0; 
                for(int y = 0; y < 2; ++y)
                for(int x = 0; x < 4; ++x){
                    test(w(x, y) == list[index]);
                    ++index;
                }
        }
        {
            int list[] = {16, 18, 20, 22, 17, 19, 21, 23};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(0,2);
            
            test(w.size()==8 && w.dimension()==2);
            int index = 0; 
                for(int y = 0; y < 2; ++y)
                for(int x = 0; x < 4; ++x){
                    test(w(x, y) == list[index]);
                    ++index;
                }
        }
        // bind(1,x)
        {
            int list[] = {6, 7, 8, 18, 19, 20};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.size()==6 && w.dimension()==2);
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(w(x, y) == list[index]);
                ++index;
            }
        }
        {
            int list[] = {4, 12, 20, 5, 13, 21};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(1,2);

            test(w.size()==6 && w.dimension()==2);
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(w(x, y) == list[index]);
                ++index;
            }
        }
    }
    // squeeze with...
    {
        // 2D to scalar 
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 1;
            shape[1] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();
            
            test(v.size()==1 && v.dimension()==0);
            test(v(0)==0);
        }
        // 2D to 1D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 24;
            shape[1] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()== 24 && v.dimension()==1);
            for(int i = 0; i < 24; ++i)
                test(v(i)==data_[i]);
        }
        // 3D to scalar 
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 1;
            shape[2] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==1 && v.dimension()==0);
            test(v(0)==0);
        } 
        // 3D to 1D with squeeze
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 24;
            shape[2] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==24 && v.dimension()==1
            );
            for(int i = 0; i < 24; ++i)
                test(v(i)==data_[i]);
        } 
        // 3D to 2D
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 3;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==6 && v.dimension()==2
            );
            int i = 0; 
            for(int y = 0; y < 2; ++y){
                for(int x = 0; x < 3; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
        // 6D to 3D
        {
            std::vector<std::size_t> shape(6);
            shape[0] = 1;
            shape[1] = 2;
            shape[2] = 1;
            shape[3] = 1;
            shape[4] = 3;
            shape[5] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==12 && v.dimension()==3
            );
            int i = 0; 
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 3; ++y){
                    for(int x = 0; x < 2; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
    }
}